

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  string *__rhs;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint majorVersion;
  uint minorVersion;
  string local_140;
  string eclipseVersion;
  RegularExpression regex;
  
  this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  std::__cxx11::string::string((string *)&regex,"CMAKE_ECLIPSE_VERSION",(allocator *)&local_140);
  pcVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&regex);
  std::__cxx11::string::string((string *)&eclipseVersion,pcVar3,(allocator *)&majorVersion);
  std::__cxx11::string::~string((string *)&regex);
  cmsys::RegularExpression::RegularExpression(&regex,".*([0-9]+\\.[0-9]+).*");
  bVar1 = cmsys::RegularExpression::find(&regex,eclipseVersion._M_dataplus._M_p);
  if (bVar1) {
    majorVersion = 0;
    minorVersion = 0;
    cmsys::RegularExpression::match_abi_cxx11_(&local_140,&regex,1);
    iVar2 = __isoc99_sscanf(local_140._M_dataplus._M_p,"%u.%u",&majorVersion,&minorVersion);
    std::__cxx11::string::~string((string *)&local_140);
    if (iVar2 == 2) {
      iVar2 = majorVersion * 1000 + minorVersion;
      if (iVar2 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      else if (iVar2 != 0xbbe) goto LAB_0035df68;
      this->SupportsGmakeErrorParser = false;
    }
  }
LAB_0035df68:
  cmMakefile::GetHomeDirectory(this_00);
  __lhs = &this->HomeDirectory;
  std::__cxx11::string::assign((char *)__lhs);
  cmMakefile::GetHomeOutputDirectory(this_00);
  __rhs = &this->HomeOutputDirectory;
  std::__cxx11::string::assign((char *)__rhs);
  std::__cxx11::string::string
            ((string *)&local_140,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",
             (allocator *)&majorVersion);
  bVar1 = cmMakefile::IsOn(this_00,&local_140);
  this->GenerateLinkedResources = bVar1;
  std::__cxx11::string::~string((string *)&local_140);
  bVar1 = std::operator!=(__lhs,__rhs);
  this->IsOutOfSourceBuild = bVar1;
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_140,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",
               (allocator *)&majorVersion);
    bVar1 = cmMakefile::IsOn(this_00,&local_140);
    this->GenerateSourceProject = bVar1;
    std::__cxx11::string::~string((string *)&local_140);
    if (this->GenerateSourceProject != false) goto LAB_0035e090;
  }
  else {
    this->GenerateSourceProject = false;
  }
  std::__cxx11::string::string
            ((string *)&local_140,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",(allocator *)&majorVersion)
  ;
  bVar1 = cmMakefile::IsOn(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_140,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,(allocator *)&majorVersion);
    cmMakefile::IssueMessage(this_00,WARNING,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
LAB_0035e090:
  bVar1 = cmsys::SystemTools::IsSubDirectory(__rhs,__lhs);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_140,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,(allocator *)&majorVersion);
    cmMakefile::IssueMessage(this_00,WARNING,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&eclipseVersion);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const cmMakefile* mf
    = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion.c_str()))
    {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res=sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion,
                                                    &minorVersion);
    if (res == 2)
      {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
        {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
        }
      if (version < 3007) // 3.7 is Indigo
        {
        this->SupportsGmakeErrorParser = false;
        }
      }
    }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory       = mf->GetHomeDirectory();
  this->HomeOutputDirectory = mf->GetHomeOutputDirectory();

  this->GenerateLinkedResources = mf->IsOn(
                                    "CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild = (this->HomeDirectory!=this->HomeOutputDirectory);

  this->GenerateSourceProject = (this->IsOutOfSourceBuild &&
                            mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if ((this->GenerateSourceProject == false)
    && (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT")))
    {
    mf->IssueMessage(cmake::WARNING,
              "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
              "but this variable is not supported anymore since CMake 2.8.7.\n"
              "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
    }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory))
    {
    mf->IssueMessage(cmake::WARNING, "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
    }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject)
    {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
    }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();
}